

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O1

void __thiscall EncodingTable::~EncodingTable(EncodingTable *this)

{
  pointer pTVar1;
  pointer pwVar2;
  
  pTVar1 = (this->entries).
           super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1);
  }
  pwVar2 = (this->valueData)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != &(this->valueData).field_2) {
    operator_delete(pwVar2);
  }
  ByteArray::~ByteArray(&this->hexData);
  return;
}

Assistant:

EncodingTable::~EncodingTable()
{

}